

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureLPS25H.cpp
# Opt level: O0

bool __thiscall RTPressureLPS25H::pressureRead(RTPressureLPS25H *this,RTIMU_DATA *data)

{
  bool bVar1;
  byte local_24;
  undefined2 local_23;
  byte local_21;
  uchar status;
  RTIMU_DATA *pRStack_20;
  uchar rawData [3];
  RTIMU_DATA *data_local;
  RTPressureLPS25H *this_local;
  
  data->pressureValid = false;
  data->temperatureValid = false;
  data->temperature = 0.0;
  data->pressure = 0.0;
  pRStack_20 = data;
  bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                            this->m_pressureAddr,'\'','\x01',&local_24,
                            "Failed to read LPS25H status");
  if (bVar1) {
    if ((local_24 & 2) != 0) {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,0xa8,'\x03',(uchar *)&local_23,
                                "Failed to read LPS25H pressure");
      if (!bVar1) {
        return false;
      }
      this->m_pressure =
           (float)((uint)local_21 << 0x10 | (uint)local_23._1_1_ << 8 | (uint)(byte)local_23) /
           4096.0;
      this->m_pressureValid = true;
    }
    if ((local_24 & 1) != 0) {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,0xab,'\x02',(uchar *)&local_23,
                                "Failed to read LPS25H temperature");
      if (!bVar1) {
        return false;
      }
      this->m_temperature = (float)(int)local_23 / 480.0 + 42.5;
      this->m_temperatureValid = true;
    }
    pRStack_20->pressureValid = (bool)(this->m_pressureValid & 1);
    pRStack_20->pressure = this->m_pressure;
    pRStack_20->temperatureValid = (bool)(this->m_temperatureValid & 1);
    pRStack_20->temperature = this->m_temperature;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPressureLPS25H::pressureRead(RTIMU_DATA& data)
{
    unsigned char rawData[3];
    unsigned char status;

    data.pressureValid = false;
    data.temperatureValid = false;
    data.temperature = 0;
    data.pressure = 0;

    if (!m_settings->HALRead(m_pressureAddr, LPS25H_STATUS_REG, 1, &status, "Failed to read LPS25H status"))
        return false;

    if (status & 2) {
        if (!m_settings->HALRead(m_pressureAddr, LPS25H_PRESS_OUT_XL + 0x80, 3, rawData, "Failed to read LPS25H pressure"))
            return false;

        m_pressure = (RTFLOAT)((((unsigned int)rawData[2]) << 16) | (((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0]) / (RTFLOAT)4096;
        m_pressureValid = true;
    }
    if (status & 1) {
        if (!m_settings->HALRead(m_pressureAddr, LPS25H_TEMP_OUT_L + 0x80, 2, rawData, "Failed to read LPS25H temperature"))
            return false;

        m_temperature = (int16_t)((((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0]) / (RTFLOAT)480 + (RTFLOAT)42.5;
        m_temperatureValid = true;
    }

    data.pressureValid = m_pressureValid;
    data.pressure = m_pressure;
    data.temperatureValid = m_temperatureValid;
    data.temperature = m_temperature;

    return true;
}